

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb-emu.c
# Opt level: O3

int sdl2_initialize(SDL2State *s)

{
  int iVar1;
  undefined8 uVar2;
  SDL_Window *pSVar3;
  SDL_Renderer *pSVar4;
  SDL_Texture *pSVar5;
  char *__format;
  
  iVar1 = SDL_Init(0x20);
  if (iVar1 == 0) {
    pSVar3 = (SDL_Window *)SDL_CreateWindow("Gameboy Emulator",0x2fff0000,0x2fff0000,800,0x2d0,0);
    s->window = pSVar3;
    if (pSVar3 == (SDL_Window *)0x0) {
      uVar2 = SDL_GetError();
      __format = "Failed to create SDL Window: %s\n";
    }
    else {
      pSVar4 = (SDL_Renderer *)SDL_CreateRenderer(pSVar3,0xffffffff,2);
      s->renderer = pSVar4;
      SDL_SetRenderDrawColor(pSVar4,0xff,0xff,0xff,0xff);
      if (s->renderer != (SDL_Renderer *)0x0) {
        pSVar5 = (SDL_Texture *)SDL_CreateTexture(s->renderer,0x16462004,2,0xa0,0x90);
        if (pSVar5 == (SDL_Texture *)0x0) {
          uVar2 = SDL_GetError();
          printf("Failed to create SDL Texture: %s\n",uVar2);
        }
        s->screen = pSVar5;
        return 0;
      }
      uVar2 = SDL_GetError();
      __format = "SDL ERROR: Unable to create renderer: %s\n";
    }
  }
  else {
    uVar2 = SDL_GetError();
    __format = "SDL ERROR: %s\n";
  }
  printf(__format,uVar2);
  return 1;
}

Assistant:

int 
sdl2_initialize(SDL2State* s) {

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        printf("SDL ERROR: %s\n", SDL_GetError());
        return 1;
    }

    s->window = SDL_CreateWindow("Gameboy Emulator", 
        SDL_WINDOWPOS_CENTERED, 
        SDL_WINDOWPOS_CENTERED, 
        5*160, 
        5*144, 
        0);
    

    if(!s->window) {
        printf("Failed to create SDL Window: %s\n", SDL_GetError());
        return 1;
    }

    s->renderer = SDL_CreateRenderer(
        s->window,
        -1,
        SDL_RENDERER_ACCELERATED
    );

  SDL_SetRenderDrawColor(s->renderer, 255, 255, 255, 255);

    if(!s->renderer) {
        printf("SDL ERROR: Unable to create renderer: %s\n", SDL_GetError());
        return 1;
    }

    SDL_Texture* texture = SDL_CreateTexture(s->renderer, SDL_PIXELFORMAT_RGBA8888, SDL_TEXTUREACCESS_TARGET, 160, 144);
    if(!texture) {
        printf("Failed to create SDL Texture: %s\n", SDL_GetError());
    }
    s->screen = texture;
	
    return 0;    
}